

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileReceiveSession.cpp
# Opt level: O2

void __thiscall FileReceiveSession::FileReceiveSession(FileReceiveSession *this,path *file)

{
  allocator<char> local_51;
  string local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"FileReceiveSession",&local_51);
  Subscriber::Subscriber(&this->super_Subscriber,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  (this->super_Subscriber)._vptr_Subscriber = (_func_int **)&PTR_on_error_00158bf0;
  boost::filesystem::basic_fstream<char,_std::char_traits<char>_>::basic_fstream(&this->stream);
  std::__cxx11::string::string((string *)&this->file,(string *)file);
  (this->fail).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->fail)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->fail).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->fail).super__Function_base._M_functor + 8) = 0;
  (this->success).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->success)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->success).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->success).super__Function_base._M_functor + 8) = 0;
  Subscriber::set_expected(&this->super_Subscriber,1);
  boost::filesystem::basic_fstream<char,_std::char_traits<char>_>::open
            (&this->stream,(char *)file,0x10);
  return;
}

Assistant:

FileReceiveSession::FileReceiveSession(const fs::path &file) :
    Subscriber("FileReceiveSession"), stream(), file(file) {
  set_expected(POLLIN);
  stream.open(file, std::ios::out);
}